

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<kj::String,kj::String>
          (String *__return_storage_ptr__,kj *this,String *params,String *params_1)

{
  String *pSVar1;
  ArrayPtr<const_char> local_40;
  ArrayPtr<const_char> local_30;
  String *local_20;
  String *params_local_1;
  String *params_local;
  
  local_20 = params;
  params_local_1 = (String *)this;
  params_local = __return_storage_ptr__;
  pSVar1 = fwd<kj::String>((NoInfer<kj::String> *)this);
  local_30 = toCharSequence<kj::String>(pSVar1);
  pSVar1 = fwd<kj::String>(local_20);
  local_40 = toCharSequence<kj::String>(pSVar1);
  _::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_30,&local_40,(ArrayPtr<const_char> *)params_1);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}